

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTextIndex::clear(ImGuiTextIndex *this)

{
  ImVector<int> *in_RDI;
  
  ImVector<int>::clear(in_RDI);
  in_RDI[1].Size = 0;
  return;
}

Assistant:

void            clear()                                 { LineOffsets.clear(); EndOffset = 0; }